

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink.h
# Opt level: O3

void __thiscall
spdlog::sinks::rotating_file_sink<std::mutex>::rotating_file_sink
          (rotating_file_sink<std::mutex> *this,filename_t *base_filename,size_t max_size,
          size_t max_files)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  size_t sVar5;
  filename_t local_50;
  
  sink::sink((sink *)this);
  *(undefined8 *)
   ((long)&(this->super_base_sink<std::mutex>).mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_base_sink<std::mutex>).mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_base_sink<std::mutex>).mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_base_sink<std::mutex>).mutex_.super___mutex_base._M_mutex + 8)
       = 0;
  (this->super_base_sink<std::mutex>).mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->super_base_sink<std::mutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__rotating_file_sink_001e7a70;
  paVar1 = &(this->base_filename_).field_2;
  (this->base_filename_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (base_filename->_M_dataplus)._M_p;
  paVar2 = &base_filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&base_filename->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->base_filename_).field_2 + 8) = uVar4;
  }
  else {
    (this->base_filename_)._M_dataplus._M_p = pcVar3;
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->base_filename_)._M_string_length = base_filename->_M_string_length;
  (base_filename->_M_dataplus)._M_p = (pointer)paVar2;
  base_filename->_M_string_length = 0;
  (base_filename->field_2)._M_local_buf[0] = '\0';
  this->max_size_ = max_size;
  this->max_files_ = max_files;
  (this->file_helper_).open_tries = 5;
  (this->file_helper_).open_interval = 10;
  (this->file_helper_).fd_ = (FILE *)0x0;
  (this->file_helper_)._filename._M_dataplus._M_p = (pointer)&(this->file_helper_)._filename.field_2
  ;
  (this->file_helper_)._filename._M_string_length = 0;
  (this->file_helper_)._filename.field_2._M_local_buf[0] = '\0';
  calc_filename(&local_50,&this->base_filename_,0);
  details::file_helper::open(&this->file_helper_,(char *)&local_50,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  sVar5 = details::file_helper::size(&this->file_helper_);
  this->current_size_ = sVar5;
  return;
}

Assistant:

rotating_file_sink(filename_t base_filename, std::size_t max_size, std::size_t max_files)
        : base_filename_(std::move(base_filename))
        , max_size_(max_size)
        , max_files_(max_files)
    {
        file_helper_.open(calc_filename(base_filename_, 0));
        current_size_ = file_helper_.size(); // expensive. called only once
    }